

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DXFLoader.cpp
# Opt level: O2

bool __thiscall
Assimp::DXFImporter::CanRead(DXFImporter *this,string *filename,IOSystem *pIOHandler,bool checkSig)

{
  bool bVar1;
  bool bVar2;
  string local_68;
  char *pTokens [4];
  
  BaseImporter::GetExtension(&local_68,filename);
  bVar1 = std::operator==(&local_68,"dxf");
  bVar2 = true;
  if (!bVar1) {
    if (local_68._M_string_length == 0 || checkSig) {
      pTokens[2] = "ENDSEC";
      pTokens[3] = "BLOCKS";
      pTokens[0] = "SECTION";
      pTokens[1] = "HEADER";
      bVar2 = BaseImporter::SearchFileHeaderForToken(pIOHandler,filename,pTokens,4,0x20,false,false)
      ;
    }
    else {
      bVar2 = false;
    }
  }
  std::__cxx11::string::~string((string *)&local_68);
  return bVar2;
}

Assistant:

bool DXFImporter::CanRead( const std::string& filename, IOSystem* pIOHandler, bool checkSig ) const {
    const std::string& extension = GetExtension( filename );
    if ( extension == desc.mFileExtensions ) {
        return true;
    }

    if ( extension.empty() || checkSig ) {
        const char *pTokens[] = { "SECTION", "HEADER", "ENDSEC", "BLOCKS" };
        return BaseImporter::SearchFileHeaderForToken(pIOHandler, filename, pTokens, 4, 32 );
    }

    return false;
}